

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O1

void __thiscall
pbrt::RGBColorSpace::RGBColorSpace
          (RGBColorSpace *this,Point2f r,Point2f g,Point2f b,SpectrumHandle *illuminant,
          RGBToSpectrumTable *rgbToSpectrumTable,Allocator alloc)

{
  SquareMatrix<3> *m_00;
  Tuple2<pbrt::Point2,_float> TVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  undefined1 (*pauVar7) [64];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  *pTVar8;
  SquareMatrix<3> *pSVar9;
  int iVar10;
  uint *puVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  int k;
  long lVar15;
  Float (*m_01) [3];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar26 [56];
  undefined1 auVar25 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar27 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  XYZ XVar31;
  SquareMatrix<3> r_1;
  SquareMatrix<3> m;
  uint local_104;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  Float FStack_e0;
  char cStack_dc;
  undefined1 auStack_d8 [16];
  undefined1 auStack_c8 [24];
  undefined8 local_b0;
  undefined4 uStack_a0;
  uint uStack_90;
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [16];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  float local_40;
  float local_3c;
  float local_38;
  
  auVar19._8_56_ = in_register_00001288;
  auVar19._0_8_ = b.super_Tuple2<pbrt::Point2,_float>;
  auVar18._8_56_ = in_register_00001248;
  auVar18._0_8_ = g.super_Tuple2<pbrt::Point2,_float>;
  auVar17._8_56_ = in_register_00001208;
  auVar17._0_8_ = r.super_Tuple2<pbrt::Point2,_float>;
  auStack_c8._0_16_ = auVar18._0_16_;
  auStack_d8 = auVar17._0_16_;
  auVar16 = vmovlhps_avx(auStack_d8,auStack_c8._0_16_);
  this->r = (Point2f)auVar16._0_8_;
  this->g = (Point2f)auVar16._8_8_;
  auStack_78 = auVar19._0_16_;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auStack_78);
  (this->b).super_Tuple2<pbrt::Point2,_float> = TVar1;
  (this->w).super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
  local_100.bits =
       (illuminant->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->illuminant,(SpectrumHandle *)&local_100,0x168,0x33e,alloc);
  m_00 = &this->XYZFromRGB;
  lVar6 = 0;
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  pSVar9 = m_00;
  do {
    auVar19 = vpbroadcastq_avx512f();
    uVar2 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar20._0_12_ = auVar19._0_12_;
    auVar20._12_4_ = pSVar9->m[1][0];
    auVar20._16_4_ = pSVar9->m[1][1];
    auVar20._20_4_ = pSVar9->m[1][2];
    auVar20._24_4_ = pSVar9->m[2][0];
    auVar20._28_4_ = pSVar9->m[2][1];
    auVar20._32_4_ = pSVar9->m[2][2];
    auVar20._36_4_ = pSVar9[1].m[0][0];
    auVar20._40_4_ = pSVar9[1].m[0][1];
    auVar20._44_4_ = pSVar9[1].m[0][2];
    auVar20._48_4_ = pSVar9[1].m[1][0];
    auVar20._52_4_ = pSVar9[1].m[1][1];
    auVar20._56_4_ = pSVar9[1].m[1][2];
    auVar20._60_4_ = pSVar9[1].m[2][0];
    *(undefined1 (*) [64])pSVar9 = auVar20;
    lVar6 = lVar6 + 1;
    pSVar9 = (SquareMatrix<3> *)(pSVar9->m + 1);
  } while (lVar6 != 3);
  lVar6 = 0;
  pSVar9 = &this->RGBFromXYZ;
  do {
    auVar19 = vpbroadcastq_avx512f();
    uVar2 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar21._0_12_ = auVar19._0_12_;
    auVar21._12_4_ = pSVar9->m[1][0];
    auVar21._16_4_ = pSVar9->m[1][1];
    auVar21._20_4_ = pSVar9->m[1][2];
    auVar21._24_4_ = pSVar9->m[2][0];
    auVar21._28_4_ = pSVar9->m[2][1];
    auVar21._32_4_ = pSVar9->m[2][2];
    auVar21._36_4_ = *(undefined4 *)(pSVar9 + 1);
    auVar21._40_4_ = *(undefined4 *)((long)(pSVar9 + 1) + 4);
    auVar21._44_4_ = *(undefined4 *)((long)(pSVar9 + 1) + 8);
    auVar21._48_4_ = *(undefined4 *)((long)(pSVar9 + 1) + 0xc);
    auVar21._52_4_ = *(undefined4 *)((long)(pSVar9 + 1) + 0x10);
    auVar21._56_4_ = *(undefined4 *)((long)(pSVar9 + 1) + 0x14);
    auVar21._60_4_ = *(undefined4 *)((long)(pSVar9 + 1) + 0x18);
    *(undefined1 (*) [64])pSVar9 = auVar21;
    lVar6 = lVar6 + 1;
    pSVar9 = (SquareMatrix<3> *)(pSVar9->m + 1);
  } while (lVar6 != 3);
  this->rgbToSpectrumTable = rgbToSpectrumTable;
  local_60.bits =
       (illuminant->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  auVar26 = ZEXT856(auVar19._8_8_);
  XVar31 = SpectrumToXYZ((SpectrumHandle *)&local_60);
  auVar25._0_8_ = XVar31._0_8_;
  auVar25._8_56_ = auVar26;
  auStack_88 = auVar25._0_16_;
  auVar24 = vmovshdup_avx(auStack_88);
  fVar29 = XVar31.Z + XVar31.X + auVar24._0_4_;
  auVar16._4_4_ = fVar29;
  auVar16._0_4_ = fVar29;
  auVar16._8_4_ = fVar29;
  auVar16._12_4_ = fVar29;
  auVar16 = vdivps_avx(auStack_88,auVar16);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar16);
  (this->w).super_Tuple2<pbrt::Point2,_float> = TVar1;
  auVar16 = vmovshdup_avx(auStack_d8);
  auVar27 = ZEXT416(0) << 0x20;
  local_3c = 0.0;
  fVar29 = auVar16._0_4_;
  local_40 = 0.0;
  auVar16 = ZEXT816(0) << 0x40;
  if ((fVar29 != 0.0) || (NAN(fVar29))) {
    auVar28._0_4_ = auStack_d8._0_4_ / fVar29;
    auVar28._4_12_ = auStack_d8._4_12_;
    local_40 = ((1.0 - auStack_d8._0_4_) - fVar29) / fVar29;
    auVar16 = vblendps_avx(auVar28,_DAT_004b90a0,0xe);
  }
  auVar28 = vmovshdup_avx(auStack_c8._0_16_);
  fVar29 = auVar28._0_4_;
  if ((fVar29 != 0.0) || (NAN(fVar29))) {
    auVar27._0_4_ = auStack_c8._0_4_ / fVar29;
    auVar27._4_12_ = auStack_c8._4_12_;
    local_3c = ((1.0 - auStack_c8._0_4_) - fVar29) / fVar29;
    auVar27 = vblendps_avx(auVar27,_DAT_004b90a0,0xe);
  }
  auStack_c8._0_4_ = XVar31.Z;
  auVar30 = vmovshdup_avx(auStack_78);
  auVar28 = ZEXT816(0) << 0x40;
  local_38 = 0.0;
  fVar29 = auVar30._0_4_;
  if ((fVar29 != 0.0) || (NAN(fVar29))) {
    auVar30._0_4_ = auStack_78._0_4_ / fVar29;
    auVar30._4_12_ = auStack_78._4_12_;
    local_38 = ((1.0 - auStack_78._0_4_) - fVar29) / fVar29;
    auVar28 = vblendps_avx(auVar30,_DAT_004b90a0,0xe);
  }
  auVar16 = vpermt2ps_avx512vl(auVar16,_DAT_004c0400,auVar27);
  local_58 = vinsertps_avx(auVar16,auVar28,0x20);
  m_01 = (Float (*) [3])local_58;
  auVar16 = vinsertps_avx(auVar28,auVar27,0x4c);
  local_48 = vmovlps_avx(auVar16);
  pTVar8 = &local_100;
  auStack_d8 = auVar24;
  Inverse<3>((SquareMatrix<3> *)m_01);
  auVar16 = auStack_d8;
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  if (cStack_dc == '\0') {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
  }
  local_b0 = 0;
  local_104 = 0;
  lVar6 = 0;
  uVar4 = auStack_c8._0_4_;
  do {
    iVar10 = (int)lVar6;
    puVar11 = (uint *)&local_b0;
    if ((iVar10 != 0) && (puVar11 = (uint *)((long)&local_b0 + 4), iVar10 != 1)) {
      puVar11 = &local_104;
    }
    *puVar11 = 0;
    lVar12 = 0;
    do {
      auVar27 = auStack_88;
      if (((int)lVar12 != 0) && (auVar27 = auVar16, (int)lVar12 != 1)) {
        auVar27 = ZEXT416((uint)uVar4);
      }
      puVar11 = (uint *)&local_b0;
      if ((iVar10 != 0) && (puVar11 = (uint *)((long)&local_b0 + 4), iVar10 != 1)) {
        puVar11 = &local_104;
      }
      auVar27 = vfmadd213ss_fma(auVar27,ZEXT416(*(uint *)((long)&pTVar8->bits + lVar12 * 4)),
                                ZEXT416(*puVar11));
      *puVar11 = auVar27._0_4_;
      uVar5 = local_b0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar6 = lVar6 + 1;
    pTVar8 = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              *)((long)&pTVar8[1].bits + 4);
  } while (lVar6 != 3);
  pauVar7 = (undefined1 (*) [64])&local_b0;
  lVar6 = 0;
  do {
    auVar19 = vpbroadcastq_avx512f();
    uVar2 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar22._0_12_ = auVar19._0_12_;
    auVar22._12_4_ = *(undefined4 *)((long)*pauVar7 + 0xc);
    auVar22._16_4_ = *(undefined4 *)((long)*pauVar7 + 0x10);
    auVar22._20_4_ = *(undefined4 *)((long)*pauVar7 + 0x14);
    auVar22._24_4_ = *(undefined4 *)((long)*pauVar7 + 0x18);
    auVar22._28_4_ = *(undefined4 *)((long)*pauVar7 + 0x1c);
    auVar22._32_4_ = *(undefined4 *)((long)*pauVar7 + 0x20);
    auVar22._36_4_ = *(undefined4 *)((long)*pauVar7 + 0x24);
    auVar22._40_4_ = *(undefined4 *)((long)*pauVar7 + 0x28);
    auVar22._44_4_ = *(undefined4 *)((long)*pauVar7 + 0x2c);
    auVar22._48_4_ = *(undefined4 *)((long)*pauVar7 + 0x30);
    auVar22._52_4_ = *(undefined4 *)((long)*pauVar7 + 0x34);
    auVar22._56_4_ = *(undefined4 *)((long)*pauVar7 + 0x38);
    auVar22._60_4_ = *(undefined4 *)((long)*pauVar7 + 0x3c);
    *pauVar7 = auVar22;
    lVar6 = lVar6 + 1;
    pauVar7 = (undefined1 (*) [64])((long)*pauVar7 + 0xc);
  } while (lVar6 != 3);
  local_b0._0_4_ = (int)uVar5;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar5;
  uStack_a0 = vextractps_avx(auVar24,1);
  uStack_90 = local_104;
  pTVar8 = &local_100;
  lVar6 = 0;
  do {
    auVar19 = vpbroadcastq_avx512f();
    uVar2 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar23._0_12_ = auVar19._0_12_;
    auVar23._12_4_ = *(undefined4 *)((long)&pTVar8[1].bits + 4);
    auVar23._16_4_ = (int)pTVar8[2].bits;
    auVar23._20_4_ = *(undefined4 *)((long)&pTVar8[2].bits + 4);
    auVar23._24_4_ = (int)pTVar8[3].bits;
    auVar23._28_4_ = *(undefined4 *)((long)&pTVar8[3].bits + 4);
    auVar23._32_4_ = (int)pTVar8[4].bits;
    auVar23._36_4_ = *(undefined4 *)((long)&pTVar8[4].bits + 4);
    auVar23._40_4_ = (int)pTVar8[5].bits;
    auVar23._44_4_ = *(undefined4 *)((long)&pTVar8[5].bits + 4);
    auVar23._48_4_ = (int)pTVar8[6].bits;
    auVar23._52_4_ = *(undefined4 *)((long)&pTVar8[6].bits + 4);
    auVar23._56_4_ = (int)pTVar8[7].bits;
    auVar23._60_4_ = *(undefined4 *)((long)&pTVar8[7].bits + 4);
    *(undefined1 (*) [64])pTVar8 = auVar23;
    lVar6 = lVar6 + 1;
    pTVar8 = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              *)((long)&pTVar8[1].bits + 4);
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    lVar12 = lVar6 * 0xc + -0x100;
    lVar13 = 0;
    puVar11 = (uint *)&local_b0;
    do {
      *(undefined4 *)((long)&local_100 + lVar13 * 4 + lVar12 + 0x100) = 0;
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      lVar15 = 0;
      puVar14 = puVar11;
      do {
        auVar16 = vfmadd231ss_fma(auVar17._0_16_,ZEXT416((uint)(*(Float (*) [3])*m_01)[lVar15]),
                                  ZEXT416(*puVar14));
        auVar17 = ZEXT1664(auVar16);
        lVar15 = lVar15 + 1;
        puVar14 = puVar14 + 3;
      } while (lVar15 != 3);
      *(int *)((long)&local_100 + lVar13 * 4 + lVar12 + 0x100) = auVar16._0_4_;
      lVar13 = lVar13 + 1;
      puVar11 = puVar11 + 1;
    } while (lVar13 != 3);
    lVar6 = lVar6 + 1;
    m_01 = m_01 + 1;
  } while (lVar6 != 3);
  (this->XYZFromRGB).m[2][2] = FStack_e0;
  *(uintptr_t *)m_00->m[0] = local_100.bits;
  *(undefined8 *)((this->XYZFromRGB).m[0] + 2) = uStack_f8;
  *(undefined8 *)((this->XYZFromRGB).m[1] + 1) = uStack_f0;
  *(undefined8 *)(this->XYZFromRGB).m[2] = uStack_e8;
  Inverse<3>(m_00);
  if (cStack_dc != '\0') {
    (this->RGBFromXYZ).m[2][2] = FStack_e0;
    *(uintptr_t *)(this->RGBFromXYZ).m[0] = local_100.bits;
    *(undefined8 *)((this->RGBFromXYZ).m[0] + 2) = uStack_f8;
    *(undefined8 *)((this->RGBFromXYZ).m[1] + 1) = uStack_f0;
    *(undefined8 *)(this->RGBFromXYZ).m[2] = uStack_e8;
    return;
  }
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
}

Assistant:

RGBColorSpace::RGBColorSpace(Point2f r, Point2f g, Point2f b, SpectrumHandle illuminant,
                             const RGBToSpectrumTable *rgbToSpectrumTable,
                             Allocator alloc)
    : r(r),
      g(g),
      b(b),
      illuminant(illuminant, alloc),
      rgbToSpectrumTable(rgbToSpectrumTable) {
    // Compute whitepoint primaries
    XYZ W = SpectrumToXYZ(illuminant);
    w = W.xy();

    // Compute XYZ coordinates of primaries
    XYZ R = XYZ::FromxyY(r), G = XYZ::FromxyY(g), B = XYZ::FromxyY(b);

    // Compute _XYZFromRGB_ matrix for color space
    SquareMatrix<3> rgb(R.X, G.X, B.X, R.Y, G.Y, B.Y, R.Z, G.Z, B.Z);
    XYZ C = *Inverse(rgb) * W;
    XYZFromRGB = rgb * SquareMatrix<3>::Diag(C[0], C[1], C[2]);

    // Compute _RGBFromXYZ_ matrix for color space
    RGBFromXYZ = *Inverse(XYZFromRGB);
}